

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INumberJudger.cpp
# Opt level: O3

bool __thiscall INumberJudger::isNumber(INumberJudger *this,string *s)

{
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  iterator iVar1;
  _Map_base<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_01;
  mapped_type *pmVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  __alloc_node_gen_t __alloc_node_gen_9;
  CharType typ;
  __alloc_node_gen_t __alloc_node_gen_8;
  __alloc_node_gen_t __alloc_node_gen_7;
  __alloc_node_gen_t __alloc_node_gen_6;
  __alloc_node_gen_t __alloc_node_gen_5;
  __alloc_node_gen_t __alloc_node_gen_4;
  __alloc_node_gen_t __alloc_node_gen_3;
  __alloc_node_gen_t __alloc_node_gen_2;
  __alloc_node_gen_t __alloc_node_gen_1;
  __alloc_node_gen_t __alloc_node_gen;
  unordered_map<INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>,_std::hash<INumberJudger::State>,_std::equal_to<INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>_>
  transfer;
  State st;
  undefined1 local_610;
  undefined1 local_60f;
  undefined1 local_60e;
  undefined1 local_60d;
  undefined1 local_60c;
  undefined1 local_60b;
  undefined1 local_60a;
  undefined1 local_609;
  undefined1 local_608;
  undefined1 local_607;
  undefined1 local_606;
  undefined1 local_605;
  undefined1 local_604;
  undefined1 local_603;
  undefined1 local_602;
  undefined1 local_601;
  undefined1 local_600;
  undefined1 local_5ff;
  undefined1 local_5fe;
  undefined1 local_5fd;
  undefined1 local_5fc;
  undefined1 local_5fb;
  undefined1 local_5fa;
  undefined1 local_5f9;
  undefined1 local_5f8;
  undefined1 local_5f7;
  undefined1 local_5f6;
  undefined1 local_5f5;
  undefined1 local_5f4;
  undefined1 local_5f3;
  undefined1 local_5f2;
  undefined1 local_5f1;
  string *local_5f0;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
  local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined4 local_5c8;
  undefined4 uStack_5c4;
  undefined4 uStack_5c0;
  undefined4 uStack_5bc;
  undefined4 local_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 local_5a8;
  undefined4 uStack_5a4;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_598;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_560;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_528;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_4f0;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_4b8;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_480;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_448;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_410;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3d8;
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_3a0;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined8 local_358;
  undefined1 local_350 [8];
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined8 local_338;
  _Hashtable<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_330;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [8];
  undefined8 local_2a8;
  size_type local_2a0;
  undefined8 local_298;
  size_type local_290;
  _Prime_rehash_policy local_288;
  undefined8 local_278;
  undefined4 local_270;
  undefined8 local_268;
  size_type local_260;
  undefined8 local_258;
  size_type local_250;
  _Prime_rehash_policy local_248;
  undefined8 local_238;
  undefined4 local_230;
  undefined8 local_228;
  size_type local_220;
  undefined8 local_218;
  size_type local_210;
  _Prime_rehash_policy local_208;
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined8 local_1e8;
  size_type local_1e0;
  undefined8 local_1d8;
  size_type local_1d0;
  _Prime_rehash_policy local_1c8;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined8 local_1a8;
  size_type local_1a0;
  undefined8 local_198;
  size_type local_190;
  _Prime_rehash_policy local_188;
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_168;
  size_type local_160;
  undefined8 local_158;
  size_type local_150;
  _Prime_rehash_policy local_148;
  undefined8 local_138;
  undefined4 local_130;
  undefined8 local_128;
  size_type local_120;
  undefined8 local_118;
  size_type local_110;
  _Prime_rehash_policy local_108;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined8 local_e8;
  size_type local_e0;
  undefined8 local_d8;
  size_type local_d0;
  _Prime_rehash_policy local_c8;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  size_type local_a0;
  undefined8 local_98;
  size_type local_90;
  _Prime_rehash_policy local_88;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_68;
  size_type local_60;
  undefined8 local_58;
  size_type local_50;
  _Prime_rehash_policy local_48;
  undefined8 local_38;
  
  local_2c8 = 0x400000002;
  uStack_2c0 = 0x100000003;
  local_2d8 = 4;
  uStack_2d4 = 0;
  uStack_2d0 = 0;
  uStack_2cc = 2;
  local_5f0 = s;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_598,&local_2d8,local_2b8,0,&local_5f1,&local_5f2,&local_5f3);
  local_3a0._M_buckets = (__buckets_ptr)&local_2a8;
  local_2b0._0_4_ = STATE_INITIAL;
  local_2a8 = 0;
  local_2a0 = local_598._M_bucket_count;
  local_298 = 0;
  local_290 = local_598._M_element_count;
  local_288._M_max_load_factor = local_598._M_rehash_policy._M_max_load_factor;
  local_288._4_4_ = local_598._M_rehash_policy._4_4_;
  local_288._M_next_resize = local_598._M_rehash_policy._M_next_resize;
  local_278 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_3a0._M_buckets,&local_598,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_3a0);
  local_5a8 = 0;
  uStack_5a4 = 2;
  uStack_5a0 = 2;
  uStack_59c = 4;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_3a0,&local_5a8,&local_598,0,&local_5f4,&local_5f5,&local_5f6);
  local_3d8._M_buckets = (__buckets_ptr)&local_268;
  local_270 = 1;
  local_268 = 0;
  local_260 = local_3a0._M_bucket_count;
  local_258 = 0;
  local_250 = local_3a0._M_element_count;
  local_248._M_max_load_factor = local_3a0._M_rehash_policy._M_max_load_factor;
  local_248._4_4_ = local_3a0._M_rehash_policy._4_4_;
  local_248._M_next_resize = local_3a0._M_rehash_policy._M_next_resize;
  local_238 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_3d8._M_buckets,&local_3a0,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_3d8);
  local_2e8 = 0x300000002;
  uStack_2e0 = 0x900000004;
  local_2f8 = 0;
  uStack_2f4 = 2;
  uStack_2f0 = 1;
  uStack_2ec = 6;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_3d8,&local_2f8,&local_2d8,0,&local_5f7,&local_5f8,&local_5f9);
  local_410._M_buckets = (__buckets_ptr)&local_228;
  local_230 = 2;
  local_228 = 0;
  local_220 = local_3d8._M_bucket_count;
  local_218 = 0;
  local_210 = local_3d8._M_element_count;
  local_208._M_max_load_factor = local_3d8._M_rehash_policy._M_max_load_factor;
  local_208._4_4_ = local_3d8._M_rehash_policy._4_4_;
  local_208._M_next_resize = local_3d8._M_rehash_policy._M_next_resize;
  local_1f8 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_410._M_buckets,&local_3d8,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_410);
  local_348 = 0;
  uStack_344 = 5;
  uStack_340 = 1;
  uStack_33c = 6;
  local_338 = 0x900000004;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_410,&local_348,&local_330,0,&local_5fa,&local_5fb,&local_5fc);
  local_448._M_buckets = (__buckets_ptr)&local_1e8;
  local_1f0 = 3;
  local_1e8 = 0;
  local_1e0 = local_410._M_bucket_count;
  local_1d8 = 0;
  local_1d0 = local_410._M_element_count;
  local_1c8._M_max_load_factor = local_410._M_rehash_policy._M_max_load_factor;
  local_1c8._4_4_ = local_410._M_rehash_policy._4_4_;
  local_1c8._M_next_resize = local_410._M_rehash_policy._M_next_resize;
  local_1b8 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_448._M_buckets,&local_410,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_448);
  local_5d0 = 0x500000000;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_448,&local_5d0,&local_5c8,0,&local_5fd,&local_5fe,&local_5ff);
  local_480._M_buckets = (__buckets_ptr)&local_1a8;
  local_1b0 = 4;
  local_1a8 = 0;
  local_1a0 = local_448._M_bucket_count;
  local_198 = 0;
  local_190 = local_448._M_element_count;
  local_188._M_max_load_factor = local_448._M_rehash_policy._M_max_load_factor;
  local_188._4_4_ = local_448._M_rehash_policy._4_4_;
  local_188._M_next_resize = local_448._M_rehash_policy._M_next_resize;
  local_178 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_480._M_buckets,&local_448,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_480);
  local_368 = 0;
  uStack_364 = 5;
  uStack_360 = 1;
  uStack_35c = 6;
  local_358 = 0x900000004;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_480,&local_368,local_350,0,&local_600,&local_601,&local_602);
  local_4b8._M_buckets = (__buckets_ptr)&local_168;
  local_170 = 5;
  local_168 = 0;
  local_160 = local_480._M_bucket_count;
  local_158 = 0;
  local_150 = local_480._M_element_count;
  local_148._M_max_load_factor = local_480._M_rehash_policy._M_max_load_factor;
  local_148._4_4_ = local_480._M_rehash_policy._4_4_;
  local_148._M_next_resize = local_480._M_rehash_policy._M_next_resize;
  local_138 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_4b8._M_buckets,&local_480,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_4b8);
  local_5b8 = 0;
  uStack_5b4 = 8;
  uStack_5b0 = 3;
  uStack_5ac = 7;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_4b8,&local_5b8,&local_5a8,0,&local_603,&local_604,&local_605);
  local_4f0._M_buckets = (__buckets_ptr)&local_128;
  local_130 = 6;
  local_128 = 0;
  local_120 = local_4b8._M_bucket_count;
  local_118 = 0;
  local_110 = local_4b8._M_element_count;
  local_108._M_max_load_factor = local_4b8._M_rehash_policy._M_max_load_factor;
  local_108._4_4_ = local_4b8._M_rehash_policy._4_4_;
  local_108._M_next_resize = local_4b8._M_rehash_policy._M_next_resize;
  local_f8 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_4f0._M_buckets,&local_4b8,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_4f0);
  local_5d8 = 0x800000000;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_4f0,&local_5d8,&local_5d0,0,&local_606,&local_607,&local_608);
  local_528._M_buckets = (__buckets_ptr)&local_e8;
  local_f0 = 7;
  local_e8 = 0;
  local_e0 = local_4f0._M_bucket_count;
  local_d8 = 0;
  local_d0 = local_4f0._M_element_count;
  local_c8._M_max_load_factor = local_4f0._M_rehash_policy._M_max_load_factor;
  local_c8._4_4_ = local_4f0._M_rehash_policy._4_4_;
  local_c8._M_next_resize = local_4f0._M_rehash_policy._M_next_resize;
  local_b8 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_528._M_buckets,&local_4f0,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_528);
  local_5c8 = 0;
  uStack_5c4 = 8;
  uStack_5c0 = 4;
  uStack_5bc = 9;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_528,&local_5c8,&local_5b8,0,&local_609,&local_60a,&local_60b);
  local_560._M_buckets = (__buckets_ptr)&local_a8;
  local_b0 = 8;
  local_a8 = 0;
  local_a0 = local_528._M_bucket_count;
  local_98 = 0;
  local_90 = local_528._M_element_count;
  local_88._M_max_load_factor = local_528._M_rehash_policy._M_max_load_factor;
  local_88._4_4_ = local_528._M_rehash_policy._4_4_;
  local_88._M_next_resize = local_528._M_rehash_policy._M_next_resize;
  local_78 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_560._M_buckets,&local_528,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>_>_>
              *)&local_560);
  local_5e0 = 0x900000004;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<INumberJudger::CharType_const,INumberJudger::State>const*>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_560,&local_5e0,&local_5d8,0,&local_60c,&local_60d,&local_60e);
  local_5e8._M_h = (__hashtable_alloc *)&local_68;
  local_70 = 9;
  local_68 = 0;
  local_60 = local_560._M_bucket_count;
  local_58 = 0;
  local_50 = local_560._M_element_count;
  local_48._M_max_load_factor = local_560._M_rehash_policy._M_max_load_factor;
  local_48._4_4_ = local_560._M_rehash_policy._4_4_;
  local_48._M_next_resize = local_560._M_rehash_policy._M_next_resize;
  local_38 = 0;
  std::
  _Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<INumberJudger::CharType_const,INumberJudger::State>,false>>>>
            ((_Hashtable<INumberJudger::CharType,std::pair<INumberJudger::CharType_const,INumberJudger::State>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>,std::__detail::_Select1st,std::equal_to<INumberJudger::CharType>,std::hash<INumberJudger::CharType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_5e8._M_h,&local_560,&local_5e8);
  std::
  _Hashtable<INumberJudger::State,std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>,std::allocator<std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>>,std::__detail::_Select1st,std::equal_to<INumberJudger::State>,std::hash<INumberJudger::State>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _Hashtable<std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>const*>
            ((_Hashtable<INumberJudger::State,std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>,std::allocator<std::pair<INumberJudger::State_const,std::unordered_map<INumberJudger::CharType,INumberJudger::State,std::hash<INumberJudger::CharType>,std::equal_to<INumberJudger::CharType>,std::allocator<std::pair<INumberJudger::CharType_const,INumberJudger::State>>>>>,std::__detail::_Select1st,std::equal_to<INumberJudger::State>,std::hash<INumberJudger::State>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_330,local_2b0,&stack0xffffffffffffffd0,0,&local_5e8,&local_60f,&local_610);
  lVar4 = 0x248;
  do {
    std::
    _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_2b0 + lVar4));
    lVar4 = lVar4 + -0x40;
  } while (lVar4 != -0x38);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_560);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_528);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_4f0);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_4b8);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_480);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_448);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_410);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_3d8);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_3a0);
  std::
  _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_598);
  local_2b0._0_4_ = STATE_INITIAL;
  uVar6 = (uint)local_5f0->_M_string_length;
  if (0 < (int)uVar6) {
    uVar5 = 0;
    do {
      bVar3 = (local_5f0->_M_dataplus)._M_p[uVar5];
      local_598._M_buckets._0_4_ = 0;
      if ((9 < (byte)(bVar3 - 0x30)) && (local_598._M_buckets._0_4_ = 1, (bVar3 & 0xdf) != 0x45)) {
        if (bVar3 < 0x2d) {
          if (bVar3 == 0x20) {
            local_598._M_buckets._0_4_ = 4;
          }
          else {
            if (bVar3 == 0x2b) goto LAB_00108a61;
LAB_00108a5a:
            local_598._M_buckets._0_4_ = 5;
          }
        }
        else if (bVar3 == 0x2d) {
LAB_00108a61:
          local_598._M_buckets._0_4_ = 3;
        }
        else {
          local_598._M_buckets._0_4_ = 2;
          if (bVar3 != 0x2e) goto LAB_00108a5a;
        }
      }
      this_00 = &std::__detail::
                 _Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_330,(key_type *)local_2b0)->_M_h;
      iVar1 = std::
              _Hashtable<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this_00,(key_type *)&local_598);
      std::__detail::
      _Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&local_330,(key_type *)local_2b0);
      if (iVar1.
          super__Node_iterator_base<std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_00108ad6;
      this_01 = (_Map_base<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)std::__detail::
                   _Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_330,(key_type *)local_2b0);
      pmVar2 = std::__detail::
               _Map_base<INumberJudger::CharType,_std::pair<const_INumberJudger::CharType,_INumberJudger::State>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::CharType>,_std::hash<INumberJudger::CharType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](this_01,(key_type *)&local_598);
      local_2b0._0_4_ = *pmVar2;
      uVar5 = uVar5 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar5);
    if ((uint)local_2b0._0_4_ < (STATE_EXP_NUMBER|STATE_INTEGER)) {
      bVar3 = (byte)(0x32c >> ((byte)local_2b0._0_4_ & 0x1f));
      goto LAB_00108ad8;
    }
  }
LAB_00108ad6:
  bVar3 = 0;
LAB_00108ad8:
  std::
  _Hashtable<INumberJudger::State,_std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>,_std::allocator<std::pair<const_INumberJudger::State,_std::unordered_map<INumberJudger::CharType,_INumberJudger::State,_std::hash<INumberJudger::CharType>,_std::equal_to<INumberJudger::CharType>,_std::allocator<std::pair<const_INumberJudger::CharType,_INumberJudger::State>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<INumberJudger::State>,_std::hash<INumberJudger::State>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_330);
  return (bool)(bVar3 & 1);
}

Assistant:

bool INumberJudger::isNumber(std::string s)
{
	std::unordered_map<State, std::unordered_map<CharType, State>> transfer{
		{STATE_INITIAL, {
							{CHAR_SPACE, STATE_INITIAL},
							{CHAR_NUMBER, STATE_INTEGER},
							{CHAR_POINT, STATE_POINT_WITHOUT_INT},
							{CHAR_SIGN, STATE_INT_SIGN},
						}},
		{STATE_INT_SIGN, {
							 {CHAR_NUMBER, STATE_INTEGER},
							 {CHAR_POINT, STATE_POINT_WITHOUT_INT},
						 }},
		{STATE_INTEGER, {
							{CHAR_NUMBER, STATE_INTEGER},
							{CHAR_EXP, STATE_EXP},
							{CHAR_POINT, STATE_POINT},
							{CHAR_SPACE, STATE_END},
						}},
		{STATE_POINT, {
						  {CHAR_NUMBER, STATE_FRACTION},
						  {CHAR_EXP, STATE_EXP},
						  {CHAR_SPACE, STATE_END},
					  }},
		{STATE_POINT_WITHOUT_INT, {
									  {CHAR_NUMBER, STATE_FRACTION},
								  }},
		{STATE_FRACTION, {
							 {CHAR_NUMBER, STATE_FRACTION},
							 {CHAR_EXP, STATE_EXP},
							 {CHAR_SPACE, STATE_END},
						 }},
		{STATE_EXP, {
						{CHAR_NUMBER, STATE_EXP_NUMBER},
						{CHAR_SIGN, STATE_EXP_SIGN},
					}},
		{STATE_EXP_SIGN, {
							 {CHAR_NUMBER, STATE_EXP_NUMBER},
						 }},
		{STATE_EXP_NUMBER, {
							   {CHAR_NUMBER, STATE_EXP_NUMBER},
							   {CHAR_SPACE, STATE_END},
						   }},
		{STATE_END, {
						{CHAR_SPACE, STATE_END},
					}}};

	int len = s.length();
	State st = STATE_INITIAL;

	for (int i = 0; i < len; i++)
	{
		CharType typ = toCharType(s[i]);
		if (transfer[st].find(typ) == transfer[st].end())
		{
			return false;
		}
		else
		{
			st = transfer[st][typ];
		}
	}
	return st == STATE_INTEGER || st == STATE_POINT || st == STATE_FRACTION || st == STATE_EXP_NUMBER || st == STATE_END;
}